

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cloud.c
# Opt level: O2

CloudNode * Cloud_bddXor(CloudManager *dd,CloudNode *f,CloudNode *g)

{
  CloudNode *pCVar1;
  CloudNode *g_00;
  
  if (((CloudNode *)0x1 < f) && ((CloudNode *)0x1 < g)) {
    pCVar1 = dd->tUnique;
    if ((f < pCVar1) || (pCVar1 + dd->nNodesAlloc <= f)) {
      __assert_fail("(f) >= dd->tUnique && (f) < dd->tUnique+dd->nNodesAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/cloud.c"
                    ,0x21d,"CloudNode *Cloud_bddXor(CloudManager *, CloudNode *, CloudNode *)");
    }
    if ((g < pCVar1) || (pCVar1 + dd->nNodesAlloc <= g)) {
      __assert_fail("(g) >= dd->tUnique && (g) < dd->tUnique+dd->nNodesAlloc",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/bool/kit/cloud.c"
                    ,0x21e,"CloudNode *Cloud_bddXor(CloudManager *, CloudNode *, CloudNode *)");
    }
    if (dd->tCaches[0] == (CloudCacheEntry2 *)0x0) {
      cloudCacheAllocate(dd,CLOUD_OPER_AND);
    }
    pCVar1 = cloudBddAnd_gate(dd,f,(CloudNode *)((ulong)g ^ 1));
    if (pCVar1 != (CloudNode *)0x0) {
      g_00 = cloudBddAnd_gate(dd,(CloudNode *)((ulong)f ^ 1),g);
      if (g_00 != (CloudNode *)0x0) {
        pCVar1 = Cloud_bddOr(dd,pCVar1,g_00);
        return pCVar1;
      }
    }
  }
  return (CloudNode *)0x0;
}

Assistant:

CloudNode * Cloud_bddXor( CloudManager * dd, CloudNode * f, CloudNode * g )
{
    CloudNode * t0, * t1, * r;
    if ( Cloud_Regular(f) == NULL || Cloud_Regular(g) == NULL )
        return NULL;
    CLOUD_ASSERT(f);
    CLOUD_ASSERT(g);
    if ( dd->tCaches[CLOUD_OPER_AND] == NULL )
        cloudCacheAllocate( dd, CLOUD_OPER_AND );
    t0 = cloudBddAnd_gate( dd, f, Cloud_Not(g) );
    if ( t0 == NULL )
        return NULL;
    t1 = cloudBddAnd_gate( dd, Cloud_Not(f), g );
    if ( t1 == NULL )
        return NULL;
    r  = Cloud_bddOr( dd, t0, t1 );
    return r;
}